

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O3

void __thiscall QPDFWriter::copyEncryptionParameters(QPDFWriter *this,QPDF *qpdf)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  element_type *peVar3;
  bool bVar4;
  int V;
  int iVar5;
  longlong lVar6;
  string *user_password;
  int iVar7;
  string OE;
  long *local_1c0 [2];
  long local_1b0 [2];
  string UE;
  QPDFObjectHandle encrypt;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_160;
  undefined1 local_150 [16];
  undefined1 local_140 [16];
  string Perms;
  string encryption_key;
  QPDFObjectHandle trailer;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  long local_c0 [2];
  long *local_b0 [2];
  long local_a0 [2];
  QPDFObjectHandle local_90;
  QPDFObjectHandle local_80;
  QPDFObjectHandle local_70;
  QPDFObjectHandle local_60;
  string local_50;
  
  ((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  preserve_encryption = false;
  QPDF::getTrailer(qpdf);
  paVar1 = &OE.field_2;
  OE._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&OE,"/Encrypt","");
  bVar4 = QPDFObjectHandle::hasKey(&trailer,&OE);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)OE._M_dataplus._M_p != paVar1) {
    operator_delete(OE._M_dataplus._M_p,
                    CONCAT71(OE.field_2._M_allocated_capacity._1_7_,OE.field_2._M_local_buf[0]) + 1)
    ;
  }
  if (bVar4) {
    generateID(this);
    paVar2 = &UE.field_2;
    UE._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&UE,"/ID","");
    QPDFObjectHandle::getKey((QPDFObjectHandle *)&encryption_key,(string *)&trailer);
    QPDFObjectHandle::getArrayItem((QPDFObjectHandle *)&Perms,(int)&encryption_key);
    QPDFObjectHandle::getStringValue_abi_cxx11_(&OE,(QPDFObjectHandle *)&Perms);
    std::__cxx11::string::operator=
              ((string *)
               &((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->id1,(string *)&OE);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)OE._M_dataplus._M_p != paVar1) {
      operator_delete(OE._M_dataplus._M_p,
                      CONCAT71(OE.field_2._M_allocated_capacity._1_7_,OE.field_2._M_local_buf[0]) +
                      1);
    }
    if (Perms._M_string_length != 0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)Perms._M_string_length);
    }
    if (encryption_key._M_string_length != 0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)encryption_key._M_string_length);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)UE._M_dataplus._M_p != paVar2) {
      operator_delete(UE._M_dataplus._M_p,
                      CONCAT71(UE.field_2._M_allocated_capacity._1_7_,UE.field_2._M_local_buf[0]) +
                      1);
    }
    OE._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&OE,"/Encrypt","");
    QPDFObjectHandle::getKey(&encrypt,(string *)&trailer);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)OE._M_dataplus._M_p != paVar1) {
      operator_delete(OE._M_dataplus._M_p,
                      CONCAT71(OE.field_2._M_allocated_capacity._1_7_,OE.field_2._M_local_buf[0]) +
                      1);
    }
    OE._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&OE,"/V","");
    QPDFObjectHandle::getKey((QPDFObjectHandle *)&UE,(string *)&encrypt);
    V = QPDFObjectHandle::getIntValueAsInt((QPDFObjectHandle *)&UE);
    if (UE._M_string_length != 0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)UE._M_string_length);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)OE._M_dataplus._M_p != paVar1) {
      operator_delete(OE._M_dataplus._M_p,
                      CONCAT71(OE.field_2._M_allocated_capacity._1_7_,OE.field_2._M_local_buf[0]) +
                      1);
    }
    iVar7 = 5;
    if (1 < V) {
      OE._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&OE,"/Length","");
      QPDFObjectHandle::getKey((QPDFObjectHandle *)&UE,(string *)&encrypt);
      iVar5 = QPDFObjectHandle::getIntValueAsInt((QPDFObjectHandle *)&UE);
      iVar7 = iVar5 + 7;
      if (-1 < iVar5) {
        iVar7 = iVar5;
      }
      if (UE._M_string_length != 0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)UE._M_string_length);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)OE._M_dataplus._M_p != paVar1) {
        operator_delete(OE._M_dataplus._M_p,
                        CONCAT71(OE.field_2._M_allocated_capacity._1_7_,OE.field_2._M_local_buf[0])
                        + 1);
      }
      iVar7 = iVar7 >> 3;
    }
    OE._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&OE,"/EncryptMetadata","");
    bVar4 = QPDFObjectHandle::hasKey(&encrypt,&OE);
    if (bVar4) {
      UE._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&UE,"/EncryptMetadata","");
      QPDFObjectHandle::getKey((QPDFObjectHandle *)&Perms,(string *)&encrypt);
      bVar4 = QPDFObjectHandle::isBool((QPDFObjectHandle *)&Perms);
      if (Perms._M_string_length != 0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)Perms._M_string_length);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)UE._M_dataplus._M_p != paVar2) {
        operator_delete(UE._M_dataplus._M_p,
                        CONCAT71(UE.field_2._M_allocated_capacity._1_7_,UE.field_2._M_local_buf[0])
                        + 1);
      }
    }
    else {
      bVar4 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)OE._M_dataplus._M_p != paVar1) {
      operator_delete(OE._M_dataplus._M_p,
                      CONCAT71(OE.field_2._M_allocated_capacity._1_7_,OE.field_2._M_local_buf[0]) +
                      1);
    }
    if (bVar4 != false) {
      OE._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&OE,"/EncryptMetadata","");
      QPDFObjectHandle::getKey((QPDFObjectHandle *)&UE,(string *)&encrypt);
      bVar4 = QPDFObjectHandle::getBoolValue((QPDFObjectHandle *)&UE);
      ((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      encrypt_metadata = bVar4;
      if (UE._M_string_length != 0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)UE._M_string_length);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)OE._M_dataplus._M_p != paVar1) {
        operator_delete(OE._M_dataplus._M_p,
                        CONCAT71(OE.field_2._M_allocated_capacity._1_7_,OE.field_2._M_local_buf[0])
                        + 1);
      }
    }
    if (3 < V) {
      ((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      encrypt_use_aes = true;
    }
    OE._M_string_length = 0;
    OE.field_2._M_local_buf[0] = '\0';
    UE._M_string_length = 0;
    UE.field_2._M_local_buf[0] = '\0';
    Perms._M_dataplus._M_p = (pointer)&Perms.field_2;
    Perms._M_string_length = 0;
    Perms.field_2._M_local_buf[0] = '\0';
    encryption_key._M_dataplus._M_p = (pointer)&encryption_key.field_2;
    encryption_key._M_string_length = 0;
    encryption_key.field_2._M_local_buf[0] = '\0';
    OE._M_dataplus._M_p = (pointer)paVar1;
    UE._M_dataplus._M_p = (pointer)paVar2;
    if (4 < V) {
      local_1c0[0] = local_1b0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1c0,"/OE","");
      QPDFObjectHandle::getKey((QPDFObjectHandle *)local_150,(string *)&encrypt);
      QPDFObjectHandle::getStringValue_abi_cxx11_
                ((string *)&local_170,(QPDFObjectHandle *)local_150);
      std::__cxx11::string::operator=((string *)&OE,(string *)local_170._M_local_buf);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_allocated_capacity != &local_160) {
        operator_delete((void *)local_170._M_allocated_capacity,local_160._M_allocated_capacity + 1)
        ;
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150._8_8_);
      }
      if (local_1c0[0] != local_1b0) {
        operator_delete(local_1c0[0],local_1b0[0] + 1);
      }
      local_1c0[0] = local_1b0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1c0,"/UE","");
      QPDFObjectHandle::getKey((QPDFObjectHandle *)local_150,(string *)&encrypt);
      QPDFObjectHandle::getStringValue_abi_cxx11_
                ((string *)&local_170,(QPDFObjectHandle *)local_150);
      std::__cxx11::string::operator=((string *)&UE,(string *)local_170._M_local_buf);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_allocated_capacity != &local_160) {
        operator_delete((void *)local_170._M_allocated_capacity,local_160._M_allocated_capacity + 1)
        ;
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150._8_8_);
      }
      if (local_1c0[0] != local_1b0) {
        operator_delete(local_1c0[0],local_1b0[0] + 1);
      }
      local_1c0[0] = local_1b0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1c0,"/Perms","");
      QPDFObjectHandle::getKey((QPDFObjectHandle *)local_150,(string *)&encrypt);
      QPDFObjectHandle::getStringValue_abi_cxx11_
                ((string *)&local_170,(QPDFObjectHandle *)local_150);
      std::__cxx11::string::operator=((string *)&Perms,(string *)local_170._M_local_buf);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_allocated_capacity != &local_160) {
        operator_delete((void *)local_170._M_allocated_capacity,local_160._M_allocated_capacity + 1)
        ;
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150._8_8_);
      }
      if (local_1c0[0] != local_1b0) {
        operator_delete(local_1c0[0],local_1b0[0] + 1);
      }
      QPDF::getEncryptionKey_abi_cxx11_((string *)&local_170,qpdf);
      std::__cxx11::string::operator=((string *)&encryption_key,(string *)local_170._M_local_buf);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_allocated_capacity != &local_160) {
        operator_delete((void *)local_170._M_allocated_capacity,local_160._M_allocated_capacity + 1)
        ;
      }
    }
    local_170._M_allocated_capacity = (size_type)&local_160;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"/R","");
    QPDFObjectHandle::getKey(&local_60,(string *)&encrypt);
    iVar5 = QPDFObjectHandle::getIntValueAsInt(&local_60);
    local_1c0[0] = local_1b0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1c0,"/P","");
    QPDFObjectHandle::getKey(&local_70,(string *)&encrypt);
    lVar6 = QPDFObjectHandle::getIntValue(&local_70);
    local_b0[0] = local_a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"/O","");
    QPDFObjectHandle::getKey(&local_80,(string *)&encrypt);
    QPDFObjectHandle::getStringValue_abi_cxx11_((string *)local_150,&local_80);
    local_d0._M_allocated_capacity = (size_type)local_c0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"/U","");
    QPDFObjectHandle::getKey(&local_90,(string *)&encrypt);
    QPDFObjectHandle::getStringValue_abi_cxx11_(&local_50,&local_90);
    peVar3 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    user_password = QPDF::getPaddedUserPassword_abi_cxx11_(qpdf);
    setEncryptionParametersInternal
              (this,V,iVar5,iVar7,(int)lVar6,(string *)local_150,&local_50,&OE,&UE,&Perms,
               &peVar3->id1,user_password,&encryption_key);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (local_90.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_90.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if ((long *)local_d0._M_allocated_capacity != local_c0) {
      operator_delete((void *)local_d0._M_allocated_capacity,local_c0[0] + 1);
    }
    if ((element_type *)local_150._0_8_ != (element_type *)local_140) {
      operator_delete((void *)local_150._0_8_,local_140._0_8_ + 1);
    }
    if (local_80.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_80.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if (local_b0[0] != local_a0) {
      operator_delete(local_b0[0],local_a0[0] + 1);
    }
    if (local_70.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_70.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if (local_1c0[0] != local_1b0) {
      operator_delete(local_1c0[0],local_1b0[0] + 1);
    }
    if (local_60.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_60.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_allocated_capacity != &local_160) {
      operator_delete((void *)local_170._M_allocated_capacity,local_160._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)encryption_key._M_dataplus._M_p != &encryption_key.field_2) {
      operator_delete(encryption_key._M_dataplus._M_p,
                      CONCAT71(encryption_key.field_2._M_allocated_capacity._1_7_,
                               encryption_key.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)Perms._M_dataplus._M_p != &Perms.field_2) {
      operator_delete(Perms._M_dataplus._M_p,
                      CONCAT71(Perms.field_2._M_allocated_capacity._1_7_,
                               Perms.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)UE._M_dataplus._M_p != &UE.field_2) {
      operator_delete(UE._M_dataplus._M_p,
                      CONCAT71(UE.field_2._M_allocated_capacity._1_7_,UE.field_2._M_local_buf[0]) +
                      1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)OE._M_dataplus._M_p != &OE.field_2) {
      operator_delete(OE._M_dataplus._M_p,
                      CONCAT71(OE.field_2._M_allocated_capacity._1_7_,OE.field_2._M_local_buf[0]) +
                      1);
    }
    if (encrypt.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (encrypt.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
  }
  if (trailer.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (trailer.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  return;
}

Assistant:

void
QPDFWriter::copyEncryptionParameters(QPDF& qpdf)
{
    m->preserve_encryption = false;
    QPDFObjectHandle trailer = qpdf.getTrailer();
    if (trailer.hasKey("/Encrypt")) {
        generateID();
        m->id1 = trailer.getKey("/ID").getArrayItem(0).getStringValue();
        QPDFObjectHandle encrypt = trailer.getKey("/Encrypt");
        int V = encrypt.getKey("/V").getIntValueAsInt();
        int key_len = 5;
        if (V > 1) {
            key_len = encrypt.getKey("/Length").getIntValueAsInt() / 8;
        }
        if (encrypt.hasKey("/EncryptMetadata") && encrypt.getKey("/EncryptMetadata").isBool()) {
            m->encrypt_metadata = encrypt.getKey("/EncryptMetadata").getBoolValue();
        }
        if (V >= 4) {
            // When copying encryption parameters, use AES even if the original file did not.
            // Acrobat doesn't create files with V >= 4 that don't use AES, and the logic of
            // figuring out whether AES is used or not is complicated with /StmF, /StrF, and /EFF
            // all potentially having different values.
            m->encrypt_use_aes = true;
        }
        QTC::TC("qpdf", "QPDFWriter copy encrypt metadata", m->encrypt_metadata ? 0 : 1);
        QTC::TC("qpdf", "QPDFWriter copy use_aes", m->encrypt_use_aes ? 0 : 1);
        std::string OE;
        std::string UE;
        std::string Perms;
        std::string encryption_key;
        if (V >= 5) {
            QTC::TC("qpdf", "QPDFWriter copy V5");
            OE = encrypt.getKey("/OE").getStringValue();
            UE = encrypt.getKey("/UE").getStringValue();
            Perms = encrypt.getKey("/Perms").getStringValue();
            encryption_key = qpdf.getEncryptionKey();
        }

        setEncryptionParametersInternal(
            V,
            encrypt.getKey("/R").getIntValueAsInt(),
            key_len,
            static_cast<int>(encrypt.getKey("/P").getIntValue()),
            encrypt.getKey("/O").getStringValue(),
            encrypt.getKey("/U").getStringValue(),
            OE,
            UE,
            Perms,
            m->id1, // m->id1 == the other file's id1
            qpdf.getPaddedUserPassword(),
            encryption_key);
    }
}